

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O1

void __thiscall IsoWriter::writeLogicalVolumeDescriptor(IsoWriter *this)

{
  uint8_t *buffer;
  int iVar1;
  char *value;
  ulong uVar2;
  size_t in_RCX;
  uint32_t *buff32;
  
  buffer = this->m_buffer;
  memset(buffer,0,0x800);
  value = (this->m_volumeLabel)._M_dataplus._M_p;
  uVar2 = (this->m_file).m_pos;
  iVar1 = this->m_tagLocationBaseAddr;
  this->m_buffer[0] = '\x06';
  this->m_buffer[1] = '\0';
  this->m_buffer[2] = '\x03';
  this->m_buffer[3] = '\0';
  this->m_buffer[6] = '\x01';
  this->m_buffer[7] = '\0';
  *(int *)(this->m_buffer + 0xc) = (int)(uVar2 >> 0xb) - iVar1;
  this->m_buffer[0x10] = '\x03';
  this->m_buffer[0x11] = '\0';
  this->m_buffer[0x12] = '\0';
  this->m_buffer[0x13] = '\0';
  this->m_buffer[0x25] = 'U';
  this->m_buffer[0x26] = 'n';
  this->m_buffer[0x27] = 'i';
  this->m_buffer[0x28] = 'c';
  this->m_buffer[0x29] = 'o';
  this->m_buffer[0x2a] = 'd';
  this->m_buffer[0x2b] = 'e';
  this->m_buffer[0x2c] = '\0';
  this->m_buffer[0x15] = 'O';
  this->m_buffer[0x16] = 'S';
  this->m_buffer[0x17] = 'T';
  this->m_buffer[0x18] = 'A';
  this->m_buffer[0x19] = ' ';
  this->m_buffer[0x1a] = 'C';
  this->m_buffer[0x1b] = 'o';
  this->m_buffer[0x1c] = 'm';
  this->m_buffer[0x1d] = 'p';
  this->m_buffer[0x1e] = 'r';
  this->m_buffer[0x1f] = 'e';
  this->m_buffer[0x20] = 's';
  this->m_buffer[0x21] = 's';
  this->m_buffer[0x22] = 'e';
  this->m_buffer[0x23] = 'd';
  this->m_buffer[0x24] = ' ';
  anon_unknown.dwarf_1264d9::writeDString(this->m_buffer + 0x54,value,0x80);
  this->m_buffer[0xd4] = '\0';
  this->m_buffer[0xd5] = '\b';
  this->m_buffer[0xd6] = '\0';
  this->m_buffer[0xd7] = '\0';
  this->m_buffer[0xd9] = '*';
  this->m_buffer[0xda] = 'O';
  this->m_buffer[0xdb] = 'S';
  this->m_buffer[0xdc] = 'T';
  this->m_buffer[0xdd] = 'A';
  this->m_buffer[0xde] = ' ';
  this->m_buffer[0xdf] = 'U';
  this->m_buffer[0xe0] = 'D';
  this->m_buffer[0xe1] = 'F';
  this->m_buffer[0xe2] = ' ';
  this->m_buffer[0xe3] = 'C';
  this->m_buffer[0xe4] = 'o';
  this->m_buffer[0xe5] = 'm';
  this->m_buffer[0xe6] = 'p';
  this->m_buffer[0xe7] = 'l';
  this->m_buffer[0xe8] = 'i';
  this->m_buffer[0xe9] = 'a';
  this->m_buffer[0xea] = 'n';
  this->m_buffer[0xeb] = 't';
  this->m_buffer[0xec] = '\0';
  this->m_buffer[0xf0] = 'P';
  this->m_buffer[0xf1] = '\x02';
  this->m_buffer[0xf2] = '\x03';
  this->m_buffer[0xf9] = '\x10';
  this->m_buffer[0x100] = '\x01';
  this->m_buffer[0x108] = 'F';
  this->m_buffer[0x10c] = '\x02';
  strcpy((char *)(this->m_buffer + 0x111),(this->m_impId)._M_dataplus._M_p);
  strcpy((char *)(this->m_buffer + 0x130),(this->m_appId)._M_dataplus._M_p);
  this->m_buffer[0x1b0] = '\0';
  this->m_buffer[0x1b1] = 0x80;
  this->m_buffer[0x1b2] = '\0';
  this->m_buffer[0x1b3] = '\0';
  this->m_buffer[0x1b4] = '@';
  this->m_buffer[0x1b5] = '\0';
  this->m_buffer[0x1b6] = '\0';
  this->m_buffer[0x1b7] = '\0';
  this->m_buffer[0x1b8] = '\x01';
  this->m_buffer[0x1b9] = '\x06';
  this->m_buffer[0x1ba] = '\x01';
  this->m_buffer[0x1bb] = '\0';
  this->m_buffer[0x1bc] = '\0';
  this->m_buffer[0x1bd] = '\0';
  this->m_buffer[0x1be] = '\x02';
  this->m_buffer[0x1bf] = '@';
  this->m_buffer[0x1d3] = 'r';
  this->m_buffer[0x1d4] = 't';
  this->m_buffer[0x1d5] = 'i';
  this->m_buffer[0x1d6] = 't';
  this->m_buffer[0x1d7] = 'i';
  this->m_buffer[0x1d8] = 'o';
  this->m_buffer[0x1d9] = 'n';
  this->m_buffer[0x1da] = '\0';
  this->m_buffer[0x1c3] = '*';
  this->m_buffer[0x1c4] = 'U';
  this->m_buffer[0x1c5] = 'D';
  this->m_buffer[0x1c6] = 'F';
  this->m_buffer[0x1c7] = ' ';
  this->m_buffer[0x1c8] = 'M';
  this->m_buffer[0x1c9] = 'e';
  this->m_buffer[0x1ca] = 't';
  this->m_buffer[0x1cb] = 'a';
  this->m_buffer[0x1cc] = 'd';
  this->m_buffer[0x1cd] = 'a';
  this->m_buffer[0x1ce] = 't';
  this->m_buffer[0x1cf] = 'a';
  this->m_buffer[0x1d0] = ' ';
  this->m_buffer[0x1d1] = 'P';
  this->m_buffer[0x1d2] = 'a';
  this->m_buffer[0x1da] = 'P';
  this->m_buffer[0x1db] = '\x02';
  this->m_buffer[0x1e2] = '\x01';
  this->m_buffer[0x1e3] = '\0';
  this->m_buffer[0x1e4] = '\0';
  this->m_buffer[0x1e5] = '\0';
  this->m_buffer[0x1e6] = '\0';
  this->m_buffer[0x1e7] = '\0';
  this->m_buffer[0x1e8] = '\0';
  this->m_buffer[0x1e9] = '\0';
  *(int *)(this->m_buffer + 0x1ea) = ~this->m_partitionStartAddress + this->m_metadataMirrorLBN;
  this->m_buffer[0x1ee] = 0xff;
  this->m_buffer[0x1ef] = 0xff;
  this->m_buffer[0x1f0] = 0xff;
  this->m_buffer[0x1f1] = 0xff;
  this->m_buffer[0x1f2] = ' ';
  this->m_buffer[499] = '\0';
  this->m_buffer[500] = '\0';
  this->m_buffer[0x1f5] = '\0';
  this->m_buffer[0x1f6] = ' ';
  this->m_buffer[0x1f7] = '\0';
  this->m_buffer[0x1f8] = '\x01';
  anon_unknown.dwarf_1264d9::calcDescriptorCRC(buffer,0x1fe);
  File::write(&this->m_file,(int)buffer,(void *)0x800,in_RCX);
  return;
}

Assistant:

void IsoWriter::writeLogicalVolumeDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::LogicalVol, absoluteSectorNum());
    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);
    const auto buff16 = reinterpret_cast<uint16_t *>(m_buffer);

    buff32[4] = 0x03;                                                            // Volume Descriptor Sequence Number
    strcpy(reinterpret_cast<char *>(m_buffer) + 21, "OSTA Compressed Unicode");  // Descriptor Character Set
    // Logical Volume Identifier
    writeDString(m_buffer + 84, m_volumeLabel.c_str(), 128);
    buff32[212 / 4] = SECTOR_SIZE;                              // Logical Block Size
    writeUDFString(m_buffer + 216, "*OSTA UDF Compliant", 32);  // Domain Identifier

    // Domain Flags #03: Hard and Soft Write-Protect
    m_buffer[242] = 0x03;

    // Logical Volume Contents Use
    m_buffer[249] = 0x10;
    m_buffer[256] = 0x01;

    m_buffer[264] = 0x46;  // partition Map Table Length ( in bytes)
    m_buffer[268] = 0x02;  // Number of Partition Maps.

    // Implementation Identifier
    strcpy(reinterpret_cast<char *>(m_buffer) + 273, m_impId.c_str());
    strcpy(reinterpret_cast<char *>(m_buffer) + 304, m_appId.c_str());

    // Integrity Sequence Extent
    buff32[432 / 4] = 0x8000;
    buff32[436 / 4] = 0x40;

    // Partition Maps
    m_buffer[440] = 0x01;    // Type 1 Partition Map
    m_buffer[441] = 0x06;    // map len
    buff16[442 / 2] = 0x01;  // Volume Sequence Number
    buff16[444 / 2] = 0x00;  // Partition Number

    m_buffer[446] = 0x02;  // Type 2 Partition Map
    m_buffer[447] = 64;    // map len
    writeUDFString(m_buffer + 450, "*UDF Metadata Partition", 32);

    buff16[482 / 2] = 0x01;  // Volume Sequence Number
    buff16[484 / 2] = 0x00;  // Partition Number
    buff16[486 / 2] = 0x00;  // Metadata File Location
    buff16[488 / 2] = 0x00;  // Metadata File Location
    // Metadata Mirror File Location, to    do: fill me. should be written here in future
    const uint32_t mirrorHeaderLocation = (m_metadataMirrorLBN - 1 - m_partitionStartAddress);
    buff16[490 / 2] = static_cast<uint16_t>(mirrorHeaderLocation % 65536);
    buff16[492 / 2] = mirrorHeaderLocation / 65536;

    // Metadata Bitmap File Location
    buff16[494 / 2] = 0xffff;
    buff16[496 / 2] = 0xffff;

    buff16[498 / 2] = 0x20;  // Allocation Unit Size (blocks) (64K in bytes)
    buff16[500 / 2] = 0x00;  // Allocation Unit Size (blocks)
    buff16[502 / 2] = 0x20;  // Alignment Unit Size (blocks) (64K in bytes)
    m_buffer[504] = 0x01;    // Flags

    calcDescriptorCRC(m_buffer, 510);
    m_file.write(m_buffer, SECTOR_SIZE);
}